

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetNavInputAmount2d
                 (ImGuiNavDirSourceFlags dir_sources,ImGuiInputReadMode mode,float slow_factor,
                 float fast_factor)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  float local_20;
  float local_1c;
  float fast_factor_local;
  float slow_factor_local;
  ImGuiInputReadMode mode_local;
  ImGuiNavDirSourceFlags dir_sources_local;
  ImVec2 delta;
  
  local_20 = fast_factor;
  local_1c = slow_factor;
  fast_factor_local = (float)mode;
  slow_factor_local = (float)dir_sources;
  ImVec2::ImVec2((ImVec2 *)&mode_local,0.0,0.0);
  if (((uint)slow_factor_local & 1) != 0) {
    bVar1 = IsKeyDown(0x202);
    bVar2 = IsKeyDown(0x201);
    bVar3 = IsKeyDown(0x204);
    bVar4 = IsKeyDown(0x203);
    ImVec2::ImVec2(&local_28,(float)bVar1 - (float)bVar2,(float)bVar3 - (float)bVar4);
    operator+=((ImVec2 *)&mode_local,&local_28);
  }
  if (((uint)slow_factor_local & 2) != 0) {
    fVar5 = GetNavInputAmount(0x11,(ImGuiInputReadMode)fast_factor_local);
    fVar6 = GetNavInputAmount(0x10,(ImGuiInputReadMode)fast_factor_local);
    fVar7 = GetNavInputAmount(0x13,(ImGuiInputReadMode)fast_factor_local);
    fVar8 = GetNavInputAmount(0x12,(ImGuiInputReadMode)fast_factor_local);
    ImVec2::ImVec2(&local_30,fVar5 - fVar6,fVar7 - fVar8);
    operator+=((ImVec2 *)&mode_local,&local_30);
  }
  if (((uint)slow_factor_local & 4) != 0) {
    fVar5 = GetNavInputAmount(5,(ImGuiInputReadMode)fast_factor_local);
    fVar6 = GetNavInputAmount(4,(ImGuiInputReadMode)fast_factor_local);
    fVar7 = GetNavInputAmount(7,(ImGuiInputReadMode)fast_factor_local);
    fVar8 = GetNavInputAmount(6,(ImGuiInputReadMode)fast_factor_local);
    ImVec2::ImVec2(&local_38,fVar5 - fVar6,fVar7 - fVar8);
    operator+=((ImVec2 *)&mode_local,&local_38);
  }
  if (((uint)slow_factor_local & 8) != 0) {
    fVar5 = GetNavInputAmount(9,(ImGuiInputReadMode)fast_factor_local);
    fVar6 = GetNavInputAmount(8,(ImGuiInputReadMode)fast_factor_local);
    fVar7 = GetNavInputAmount(0xb,(ImGuiInputReadMode)fast_factor_local);
    fVar8 = GetNavInputAmount(10,(ImGuiInputReadMode)fast_factor_local);
    ImVec2::ImVec2(&local_40,fVar5 - fVar6,fVar7 - fVar8);
    operator+=((ImVec2 *)&mode_local,&local_40);
  }
  if (((local_1c != 0.0) || (NAN(local_1c))) && (bVar1 = IsNavInputDown(0xe), bVar1)) {
    operator*=((ImVec2 *)&mode_local,local_1c);
  }
  if (((local_20 != 0.0) || (NAN(local_20))) && (bVar1 = IsNavInputDown(0xf), bVar1)) {
    operator*=((ImVec2 *)&mode_local,local_20);
  }
  return _mode_local;
}

Assistant:

ImVec2 ImGui::GetNavInputAmount2d(ImGuiNavDirSourceFlags dir_sources, ImGuiInputReadMode mode, float slow_factor, float fast_factor)
{
    ImVec2 delta(0.0f, 0.0f);
    if (dir_sources & ImGuiNavDirSourceFlags_RawKeyboard)
        delta += ImVec2((float)IsKeyDown(ImGuiKey_RightArrow) - (float)IsKeyDown(ImGuiKey_LeftArrow), (float)IsKeyDown(ImGuiKey_DownArrow) - (float)IsKeyDown(ImGuiKey_UpArrow));
    if (dir_sources & ImGuiNavDirSourceFlags_Keyboard)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_KeyRight_, mode)   - GetNavInputAmount(ImGuiNavInput_KeyLeft_,   mode), GetNavInputAmount(ImGuiNavInput_KeyDown_,   mode) - GetNavInputAmount(ImGuiNavInput_KeyUp_,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadDPad)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_DpadRight, mode)   - GetNavInputAmount(ImGuiNavInput_DpadLeft,   mode), GetNavInputAmount(ImGuiNavInput_DpadDown,   mode) - GetNavInputAmount(ImGuiNavInput_DpadUp,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadLStick)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_LStickRight, mode) - GetNavInputAmount(ImGuiNavInput_LStickLeft, mode), GetNavInputAmount(ImGuiNavInput_LStickDown, mode) - GetNavInputAmount(ImGuiNavInput_LStickUp, mode));
    if (slow_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakSlow))
        delta *= slow_factor;
    if (fast_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakFast))
        delta *= fast_factor;
    return delta;
}